

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_string.c
# Opt level: O2

char * canonical_charset_name(char *charset)

{
  long lVar1;
  int iVar2;
  size_t sVar3;
  long lVar4;
  char cVar5;
  char *pcVar6;
  char cVar7;
  char cs [16];
  
  if (charset == (char *)0x0) {
    pcVar6 = (char *)0x0;
  }
  else {
    cVar7 = *charset;
    pcVar6 = charset;
    if ((cVar7 != '\0') && (sVar3 = strlen(charset), sVar3 < 0x10)) {
      lVar4 = 0;
      while (cVar7 != '\0') {
        cVar5 = cVar7 + -0x20;
        if (0x19 < (byte)(cVar7 + 0x9fU)) {
          cVar5 = cVar7;
        }
        cs[lVar4] = cVar5;
        lVar1 = lVar4 + 1;
        lVar4 = lVar4 + 1;
        cVar7 = charset[lVar1];
      }
      cs[lVar4] = '\0';
      iVar2 = bcmp(cs,"UTF-8",6);
      pcVar6 = "UTF-8";
      if ((iVar2 != 0) && (iVar2 = bcmp(cs,"UTF8",5), iVar2 != 0)) {
        iVar2 = bcmp(cs,"UTF-16BE",9);
        pcVar6 = "UTF-16BE";
        if (cs._0_8_ != 0x45423631465455 && iVar2 != 0) {
          iVar2 = bcmp(cs,"UTF-16LE",9);
          pcVar6 = "UTF-16LE";
          if ((cs._0_8_ != 0x454c3631465455 && iVar2 != 0) &&
             (iVar2 = bcmp(cs,"CP932",6), pcVar6 = charset, iVar2 == 0)) {
            pcVar6 = "CP932";
          }
        }
      }
    }
  }
  return pcVar6;
}

Assistant:

static const char *
canonical_charset_name(const char *charset)
{
	char cs[16];
	char *p;
	const char *s;

	if (charset == NULL || charset[0] == '\0'
	    || strlen(charset) > 15)
		return (charset);

	/* Copy name to uppercase. */
	p = cs;
	s = charset;
	while (*s) {
		char c = *s++;
		if (c >= 'a' && c <= 'z')
			c -= 'a' - 'A';
		*p++ = c;
	}
	*p++ = '\0';

	if (strcmp(cs, "UTF-8") == 0 ||
	    strcmp(cs, "UTF8") == 0)
		return ("UTF-8");
	if (strcmp(cs, "UTF-16BE") == 0 ||
	    strcmp(cs, "UTF16BE") == 0)
		return ("UTF-16BE");
	if (strcmp(cs, "UTF-16LE") == 0 ||
	    strcmp(cs, "UTF16LE") == 0)
		return ("UTF-16LE");
	if (strcmp(cs, "CP932") == 0)
		return ("CP932");
	return (charset);
}